

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O2

int auxresume(lua_State *L,lua_State *co,int narg)

{
  int iVar1;
  uint uVar2;
  char *s;
  
  iVar1 = lua_checkstack(co,narg);
  if (iVar1 == 0) {
    s = "too many arguments to resume";
  }
  else {
    iVar1 = lua_status(co);
    if ((iVar1 == 0) && (iVar1 = lua_gettop(co), iVar1 == 0)) {
      s = "cannot resume dead coroutine";
    }
    else {
      lua_xmove(L,co,narg);
      uVar2 = lua_resume(co,L,narg);
      if (1 < uVar2) {
        lua_xmove(co,L,1);
        return -1;
      }
      uVar2 = lua_gettop(co);
      iVar1 = lua_checkstack(L,uVar2 + 1);
      if (iVar1 != 0) {
        lua_xmove(co,L,uVar2);
        return uVar2;
      }
      lua_settop(co,~uVar2);
      s = "too many results to resume";
    }
  }
  lua_pushstring(L,s);
  return -1;
}

Assistant:

static int auxresume (lua_State *L, lua_State *co, int narg) {
  int status;
  if (!lua_checkstack(co, narg)) {
    lua_pushliteral(L, "too many arguments to resume");
    return -1;  /* error flag */
  }
  if (lua_status(co) == LUA_OK && lua_gettop(co) == 0) {
    lua_pushliteral(L, "cannot resume dead coroutine");
    return -1;  /* error flag */
  }
  lua_xmove(L, co, narg);
  status = lua_resume(co, L, narg);
  if (status == LUA_OK || status == LUA_YIELD) {
    int nres = lua_gettop(co);
    if (!lua_checkstack(L, nres + 1)) {
      lua_pop(co, nres);  /* remove results anyway */
      lua_pushliteral(L, "too many results to resume");
      return -1;  /* error flag */
    }
    lua_xmove(co, L, nres);  /* move yielded values */
    return nres;
  }
  else {
    lua_xmove(co, L, 1);  /* move error message */
    return -1;  /* error flag */
  }
}